

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

void av1_set_ref_frame(MV_REFERENCE_FRAME *rf,MV_REFERENCE_FRAME ref_frame_type)

{
  MV_REFERENCE_FRAME ref_frame_type_local;
  MV_REFERENCE_FRAME *rf_local;
  
  if (ref_frame_type < '\b') {
    *rf = ref_frame_type;
    rf[1] = -1;
  }
  else {
    *rf = ref_frame_map[ref_frame_type + -8][0];
    rf[1] = ref_frame_map[ref_frame_type + -8][1];
  }
  return;
}

Assistant:

static inline void av1_set_ref_frame(MV_REFERENCE_FRAME *rf,
                                     MV_REFERENCE_FRAME ref_frame_type) {
  if (ref_frame_type >= REF_FRAMES) {
    rf[0] = ref_frame_map[ref_frame_type - REF_FRAMES][0];
    rf[1] = ref_frame_map[ref_frame_type - REF_FRAMES][1];
  } else {
    assert(ref_frame_type > NONE_FRAME);
    rf[0] = ref_frame_type;
    rf[1] = NONE_FRAME;
  }
}